

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Code.cpp
# Opt level: O2

bool isValidCode(string *str)

{
  char cVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  for (sVar2 = 0; str->_M_string_length != sVar2; sVar2 = sVar2 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[sVar2];
    lVar4 = -(ulong)(cVar1 == ')');
    if (cVar1 == '(') {
      lVar4 = 1;
    }
    lVar3 = lVar3 + lVar4;
  }
  if (-1 < lVar3) {
    return lVar3 == 0;
  }
  __assert_fail("count >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Final/src/Code.cpp"
                ,0x11,"bool isValidCode(std::string &)");
}

Assistant:

bool isValidCode(std::string &str) {
    unsigned long i = 0;
    long count = 0;
    for (i = 0; i < str.length(); i++) {
        if (str[i] == '(') {
            count++;
        } else if (str[i] == ')') {
            count--;
        }
    }
    assert(count >= 0);
    if (count == 0) {
        return true;
    } else if (count > 0) {
        return false;
    }
}